

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_client_connection.c
# Opt level: O0

adt_error_t message_client_prepare_message(message_client_connection_t *self,adt_str_t *message)

{
  char cVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  adt_bytearray_t *paVar5;
  undefined8 uVar6;
  adt_error_t rc;
  adt_bytearray_t *messageBytes;
  int32_t headerSize;
  int32_t messageSize;
  uint8_t headerData [4];
  adt_str_t *message_local;
  message_client_connection_t *self_local;
  
  if ((self == (message_client_connection_t *)0x0) || (message == (adt_str_t *)0x0)) {
    self_local._7_1_ = '\x01';
  }
  else {
    _messageSize = message;
    lVar4 = adt_str_bytearray(message);
    if (lVar4 == 0) {
      self_local._7_1_ = '\x02';
    }
    else {
      if (self->pendingMessage == (adt_bytearray_t *)0x0) {
        paVar5 = (adt_bytearray_t *)adt_bytearray_new(0x100);
        self->pendingMessage = paVar5;
        if (self->pendingMessage == (adt_bytearray_t *)0x0) {
          return '\x02';
        }
      }
      else {
        adt_bytearray_clear(self->pendingMessage);
      }
      if (self->pendingMessage == (adt_bytearray_t *)0x0) {
        __assert_fail("self->pendingMessage != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/message_client_connection.c"
                      ,0x8a,
                      "adt_error_t message_client_prepare_message(message_client_connection_t *, adt_str_t *)"
                     );
      }
      if (lVar4 == 0) {
        __assert_fail("messageBytes != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/message_client_connection.c"
                      ,0x8b,
                      "adt_error_t message_client_prepare_message(message_client_connection_t *, adt_str_t *)"
                     );
      }
      uVar2 = adt_bytearray_length(lVar4);
      iVar3 = numheader_encode32(&headerSize,4,uVar2);
      if ((0 < iVar3) && (iVar3 < 5)) {
        cVar1 = adt_bytearray_append(self->pendingMessage,&headerSize,iVar3);
        if (cVar1 != '\0') {
          return cVar1;
        }
        paVar5 = self->pendingMessage;
        uVar6 = adt_bytearray_data(lVar4);
        adt_bytearray_append(paVar5,uVar6,uVar2);
      }
      adt_bytearray_delete(lVar4);
      self_local._7_1_ = '\0';
    }
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t message_client_prepare_message(message_client_connection_t *self, adt_str_t *message)
{
   if ( (self != 0) && (message != 0) )
   {
      uint8_t headerData[UINT32_SIZE];
      int32_t messageSize;
      int32_t headerSize;
      adt_bytearray_t *messageBytes = adt_str_bytearray(message);
      if (messageBytes == 0)
      {
         return ADT_MEM_ERROR;
      }
      if (self->pendingMessage == 0)
      {
         self->pendingMessage = adt_bytearray_new(BUFFER_GROW_SIZE);
         if (self->pendingMessage == 0)
         {
            return ADT_MEM_ERROR;
         }
      }
      else
      {
         adt_bytearray_clear(self->pendingMessage);
      }
      assert(self->pendingMessage != 0);
      assert(messageBytes != 0);
      messageSize = adt_bytearray_length(messageBytes);
      headerSize = numheader_encode32(&headerData[0], UINT32_SIZE, messageSize);
      if ( (headerSize > 0) && (headerSize <= UINT32_SIZE) )
      {
         adt_error_t rc = adt_bytearray_append(self->pendingMessage, &headerData[0], headerSize);
         if (rc != ADT_NO_ERROR)
         {
            return rc;
         }
         adt_bytearray_append(self->pendingMessage, adt_bytearray_data(messageBytes), messageSize);
         if (rc != ADT_NO_ERROR)
         {
            return rc;
         }
      }
      adt_bytearray_delete(messageBytes);
      //printf("Prepared %d+%d bytes of data\n", (int) headerSize, (int) messageSize);
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}